

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O0

void TestImpl(char *name,Span<const_unsigned_char> der,char *password,char *friendly_name)

{
  bool bVar1;
  stack_st_X509 *__p;
  char *pcVar2;
  pointer psVar3;
  X509 *x;
  size_t extraout_RDX;
  char *in_R9;
  Span<const_unsigned_char> b;
  AssertHelper local_1f8;
  Message local_1f0;
  Span<const_unsigned_char> local_1e8;
  string_view local_1d8;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_2;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_1;
  uint8_t *actual_name;
  undefined1 local_188 [4];
  int actual_name_len;
  AssertHelper local_168;
  Message local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__2;
  Message local_140;
  size_t local_138;
  uint local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar;
  UniquePtr<EVP_PKEY> delete_key;
  AssertHelper local_f0;
  Message local_e8;
  int local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_b0 [8];
  CBS pkcs12;
  EVP_PKEY *key;
  string local_90;
  AssertHelper local_70;
  Message local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  unique_ptr<stack_st_X509,_bssl::internal::Deleter> local_40;
  UniquePtr<struct_stack_st_X509> certs;
  char *pcStack_30;
  ScopedTrace gtest_trace_41;
  char *friendly_name_local;
  char *password_local;
  char *name_local;
  Span<const_unsigned_char> der_local;
  
  pcStack_30 = friendly_name;
  testing::ScopedTrace::ScopedTrace
            ((ScopedTrace *)
             ((long)&certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl + 7),
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
             ,0x29,name);
  __p = sk_X509_new_null();
  std::unique_ptr<stack_st_X509,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<stack_st_X509,bssl::internal::Deleter> *)&local_40,__p);
  testing::AssertionResult::AssertionResult<std::unique_ptr<stack_st_X509,bssl::internal::Deleter>>
            ((AssertionResult *)local_60,&local_40,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)local_60,(AssertionResult *)0x8ba81c,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  if (bVar1) {
    pkcs12.len = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )der.data_;
    cbs_st::cbs_st((cbs_st *)local_b0,der);
    psVar3 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get(&local_40);
    local_dc = PKCS12_get_key_and_certs((EVP_PKEY **)&pkcs12.len,psVar3,(CBS *)local_b0,password);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_d8,&local_dc,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&delete_key,(internal *)local_d8,
                 (AssertionResult *)"PKCS12_get_key_and_certs(&key, certs.get(), &pkcs12, password)"
                 ,"false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x2f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      std::__cxx11::string::~string((string *)&delete_key);
      testing::Message::~Message(&local_e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
    if (bVar1) {
      std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&gtest_ar.message_,
                 (pointer)pkcs12.len);
      local_12c = 1;
      psVar3 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get(&local_40);
      local_138 = sk_X509_num(psVar3);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                ((EqHelper *)local_128,"1u","sk_X509_num(certs.get())",&local_12c,&local_138);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
      if (!bVar1) {
        testing::Message::Message(&local_140);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                   ,0x32,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_140)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_140);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
      if (bVar1) {
        testing::AssertionResult::AssertionResult<evp_pkey_st*>
                  ((AssertionResult *)local_158,(evp_pkey_st **)&pkcs12.len,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
        if (!bVar1) {
          testing::Message::Message(&local_160);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_188,(internal *)local_158,(AssertionResult *)0x8f28b1,"false",
                     "true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                     ,0x33,pcVar2);
          testing::internal::AssertHelper::operator=(&local_168,&local_160);
          testing::internal::AssertHelper::~AssertHelper(&local_168);
          std::__cxx11::string::~string((string *)local_188);
          testing::Message::~Message(&local_160);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
        if (bVar1) {
          psVar3 = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get(&local_40);
          x = (X509 *)sk_X509_value(psVar3,0);
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )X509_alias_get0(x,(int *)((long)&actual_name + 4));
          if (pcStack_30 == (char *)0x0) {
            testing::internal::EqHelper::Compare<unsigned_char_const>
                      ((EqHelper *)local_1a8,"nullptr","actual_name",(nullptr_t)0x0,
                       (uchar *)gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
            if (!bVar1) {
              testing::Message::Message(&local_1b0);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                         ,0x39,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_2.message_,&local_1b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
              testing::Message::~Message(&local_1b0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
          }
          else {
            bssl::Span<const_unsigned_char>::Span
                      (&local_1e8,
                       (uchar *)gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl,(long)actual_name._4_4_);
            b.size_ = extraout_RDX;
            b.data_ = (uchar *)local_1e8.size_;
            local_1d8 = bssl::BytesAsStringView((bssl *)local_1e8.data_,b);
            testing::internal::EqHelper::
            Compare<const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                      ((EqHelper *)local_1c8,"friendly_name",
                       "bssl::BytesAsStringView( bssl::Span(actual_name, actual_name_len))",
                       &stack0xffffffffffffffd0,&local_1d8);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
            if (!bVar1) {
              testing::Message::Message(&local_1f0);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
              testing::internal::AssertHelper::AssertHelper
                        (&local_1f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                         ,0x3c,pcVar2);
              testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
              testing::internal::AssertHelper::~AssertHelper(&local_1f8);
              testing::Message::~Message(&local_1f0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
          }
        }
      }
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar.message_);
    }
  }
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&local_40);
  testing::ScopedTrace::~ScopedTrace
            ((ScopedTrace *)
             ((long)&certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl + 7));
  return;
}

Assistant:

static void TestImpl(const char *name, bssl::Span<const uint8_t> der,
                     const char *password,
                     const char *friendly_name) {
  SCOPED_TRACE(name);
  bssl::UniquePtr<STACK_OF(X509)> certs(sk_X509_new_null());
  ASSERT_TRUE(certs);

  EVP_PKEY *key = nullptr;
  CBS pkcs12 = der;
  ASSERT_TRUE(PKCS12_get_key_and_certs(&key, certs.get(), &pkcs12, password));
  bssl::UniquePtr<EVP_PKEY> delete_key(key);

  ASSERT_EQ(1u, sk_X509_num(certs.get()));
  ASSERT_TRUE(key);

  int actual_name_len;
  const uint8_t *actual_name =
      X509_alias_get0(sk_X509_value(certs.get(), 0), &actual_name_len);
  if (friendly_name == nullptr) {
    EXPECT_EQ(nullptr, actual_name);
  } else {
    EXPECT_EQ(friendly_name, bssl::BytesAsStringView(
                                 bssl::Span(actual_name, actual_name_len)));
  }
}